

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O2

void Gia_ManBuiltInSimStart(Gia_Man_t *p,int nWords,int nObjs)

{
  Vec_Wrd_t *pVVar1;
  word Entry;
  word Fill;
  word Fill_00;
  int iVar2;
  int iVar3;
  
  if (p->fBuiltInSim != 0) {
    __assert_fail("!p->fBuiltInSim",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x30b,"void Gia_ManBuiltInSimStart(Gia_Man_t *, int, int)");
  }
  if (p->nObjs == p->vCis->nSize + p->vCos->nSize + 1) {
    p->fBuiltInSim = 1;
    p->iPatsPi = 0;
    p->iPastPiMax = 0;
    p->nSimWordsMax = 8;
    p->nSimWords = nWords;
    Gia_ManRandomW(1);
    pVVar1 = Vec_WrdAlloc(p->vCis->nSize * p->nSimWords);
    p->vSimsPi = pVVar1;
    Vec_WrdFill(pVVar1,p->vCis->nSize * p->nSimWords,Fill);
    pVVar1 = Vec_WrdAlloc(nObjs * p->nSimWords);
    p->vSims = pVVar1;
    Vec_WrdFill(pVVar1,p->nSimWords,Fill_00);
    for (iVar2 = 0; iVar2 < p->vCis->nSize; iVar2 = iVar2 + 1) {
      for (iVar3 = 0; iVar3 < p->nSimWords; iVar3 = iVar3 + 1) {
        pVVar1 = p->vSims;
        Entry = Gia_ManRandomW(0);
        Vec_WrdPush(pVVar1,Entry);
      }
    }
    return;
  }
  __assert_fail("Gia_ManAndNum(p) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                ,0x30c,"void Gia_ManBuiltInSimStart(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_ManBuiltInSimStart( Gia_Man_t * p, int nWords, int nObjs )
{
    int i, k;
    assert( !p->fBuiltInSim );
    assert( Gia_ManAndNum(p) == 0 );
    p->fBuiltInSim = 1;
    p->iPatsPi = 0;
    p->iPastPiMax = 0;
    p->nSimWords = nWords;
    p->nSimWordsMax = 8;
    Gia_ManRandomW( 1 );
    // init PI care info
    p->vSimsPi = Vec_WrdAlloc( p->nSimWords * Gia_ManCiNum(p) );
    Vec_WrdFill( p->vSimsPi, p->nSimWords * Gia_ManCiNum(p), 0 );
    // init object sim info
    p->vSims = Vec_WrdAlloc( p->nSimWords * nObjs );
    Vec_WrdFill( p->vSims, p->nSimWords, 0 );
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        for ( k = 0; k < p->nSimWords; k++ )
            Vec_WrdPush( p->vSims, Gia_ManRandomW(0) );
}